

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test::testBody
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsListForTest expectations;
  MockExpectedCallsDidntHappenFailure expectedFailure;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest(&expectations);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction(&expectations,(SimpleString *)&expectedFailure)
  ;
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])(pMVar2);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar2,1);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x39])(pMVar2);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])(pMVar2);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction(&expectations,(SimpleString *)&expectedFailure)
  ;
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])(pMVar2);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  test = mockFailureTest();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            (&expectedFailure,test,&expectations.super_MockExpectedCallsList);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_90);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))((long *)CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_90);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))
            ((long *)CONCAT44(extraout_var_00,iVar1));
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&local_a0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x25f);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&expectations);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCallsButOneDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockCheckedExpectedCall* call = expectations.addFunction("boo");
    call->ignoreOtherParameters();
    call->callWasMade(1);
    call->finalizeActualCallMatch();
    call->ignoreOtherParameters();
    expectations.addFunction("boo")->ignoreOtherParameters();
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().actualCall("boo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}